

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_simple.cpp
# Opt level: O0

BoundStatement * __thiscall duckdb::Binder::Bind(Binder *this,AlterStatement *stmt)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  iVar1;
  initializer_list<duckdb::LogicalType> iVar2;
  QueryErrorContext error_context_p;
  bool bVar3;
  int iVar4;
  pointer pAVar5;
  CatalogEntry *pCVar6;
  undefined4 extraout_var;
  undefined8 uVar7;
  string *args;
  undefined4 extraout_var_00;
  string *psVar8;
  pointer pAVar9;
  BoundStatement *in_RDI;
  Catalog *catalog;
  StatementProperties *properties;
  EntryLookupInfo lookup_info;
  SetColumnCommentInfo *info;
  optional_ptr<duckdb::CatalogEntry,_true> entry;
  BoundStatement result;
  BoundStatement *in_stack_fffffffffffffc58;
  Binder *in_stack_fffffffffffffc60;
  undefined7 in_stack_fffffffffffffc68;
  OnEntryNotFound in_stack_fffffffffffffc6f;
  undefined7 in_stack_fffffffffffffc70;
  undefined1 in_stack_fffffffffffffc77;
  Catalog *in_stack_fffffffffffffc78;
  StatementProperties *in_stack_fffffffffffffc80;
  CatalogEntryRetriever *in_stack_fffffffffffffc88;
  CatalogEntryRetriever *in_stack_fffffffffffffca0;
  SetColumnCommentInfo *in_stack_fffffffffffffca8;
  _Head_base<0UL,_duckdb::Binding_*,_false> *local_220;
  string *local_200;
  undefined1 local_1c8 [40];
  string local_1a0 [32];
  __node_base_ptr local_180;
  undefined4 local_178;
  undefined1 local_171;
  StatementProperties *local_160;
  CatalogEntry *local_158;
  optional_idx local_150;
  QueryErrorContext local_148 [5];
  CatalogEntry *local_120;
  SetColumnCommentInfo *local_118;
  optional_ptr<duckdb::CatalogEntry,_true> local_110 [2];
  tuple<duckdb::Binding_*,_std::default_delete<duckdb::Binding>_> *local_100;
  _Head_base<0UL,_duckdb::Binding_*,_false> local_f8 [3];
  _Head_base<0UL,_duckdb::Binding_*,_false> local_e0;
  __node_base local_d8;
  undefined1 local_b5;
  allocator local_a1;
  string *local_a0;
  string local_98 [32];
  string *local_78;
  size_t local_70;
  pointer in_stack_ffffffffffffffa0;
  CatalogEntry *in_stack_ffffffffffffffa8;
  pointer in_stack_ffffffffffffffb0;
  optional_ptr<duckdb::BoundParameterMap,_true> in_stack_ffffffffffffffb8;
  
  BoundStatement::BoundStatement((BoundStatement *)in_stack_fffffffffffffc60);
  local_b5 = 1;
  local_a0 = local_98;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_98,"Success",&local_a1);
  local_b5 = 0;
  local_78 = local_98;
  local_70 = 1;
  ::std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)0xde788b);
  iVar1._M_array._7_1_ = in_stack_fffffffffffffc6f;
  iVar1._M_array._0_7_ = in_stack_fffffffffffffc68;
  iVar1._M_len._0_7_ = in_stack_fffffffffffffc70;
  iVar1._M_len._7_1_ = in_stack_fffffffffffffc77;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
  vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *)in_stack_fffffffffffffc60,iVar1,(allocator_type *)in_stack_fffffffffffffc58);
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
  operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             *)in_stack_fffffffffffffc60,
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             *)in_stack_fffffffffffffc58);
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
  ~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           *)0xde78d8);
  ::std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)0xde78e5);
  local_200 = (string *)&local_78;
  do {
    local_200 = local_200 + -0x20;
    ::std::__cxx11::string::~string(local_200);
  } while (local_200 != local_98);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  local_100 = (tuple<duckdb::Binding_*,_std::default_delete<duckdb::Binding>_> *)local_f8;
  LogicalType::LogicalType
            ((LogicalType *)in_stack_fffffffffffffc80,
             (LogicalTypeId)((ulong)in_stack_fffffffffffffc78 >> 0x38));
  local_e0._M_head_impl = (Binding *)local_f8;
  local_d8._M_nxt = (_Hash_node_base *)0x1;
  ::std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0xde7991);
  iVar2._M_array._7_1_ = in_stack_fffffffffffffc6f;
  iVar2._M_array._0_7_ = in_stack_fffffffffffffc68;
  iVar2._M_len._0_7_ = in_stack_fffffffffffffc70;
  iVar2._M_len._7_1_ = in_stack_fffffffffffffc77;
  vector<duckdb::LogicalType,_true>::vector
            ((vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffc60,iVar2,
             (allocator_type *)in_stack_fffffffffffffc58);
  vector<duckdb::LogicalType,_true>::operator=
            ((vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffc60,
             (vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffc58);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0xde79de);
  ::std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0xde79eb);
  local_220 = &local_e0;
  do {
    local_220 = local_220 + -3;
    LogicalType::~LogicalType((LogicalType *)0xde7a20);
  } while (local_220 != local_f8);
  unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true>::operator->
            ((unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true> *)
             in_stack_fffffffffffffc60);
  unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true>::operator->
            ((unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true> *)
             in_stack_fffffffffffffc60);
  BindSchemaOrCatalog(in_stack_fffffffffffffc60,(string *)in_stack_fffffffffffffc58,
                      (string *)0xde7aa8);
  optional_ptr<duckdb::CatalogEntry,_true>::optional_ptr(local_110);
  pAVar5 = unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true>::operator->
                     ((unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true> *
                      )in_stack_fffffffffffffc60);
  if ((pAVar5->super_ParseInfo).field_0x9 == '\b') {
    unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true>::operator->
              ((unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true> *)
               in_stack_fffffffffffffc60);
    local_118 = ParseInfo::Cast<duckdb::SetColumnCommentInfo>
                          ((ParseInfo *)in_stack_fffffffffffffc60);
    local_120 = (CatalogEntry *)
                SetColumnCommentInfo::TryResolveCatalogEntry
                          (in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
    local_110[0] = (optional_ptr<duckdb::CatalogEntry,_true>)local_120;
  }
  else {
    pAVar5 = unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true>::operator->
                       ((unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true>
                         *)in_stack_fffffffffffffc60);
    (*(pAVar5->super_ParseInfo)._vptr_ParseInfo[3])();
    unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true>::operator->
              ((unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true> *)
               in_stack_fffffffffffffc60);
    optional_idx::optional_idx(&local_150);
    QueryErrorContext::QueryErrorContext(local_148,local_150);
    error_context_p.query_location.index._7_1_ = in_stack_fffffffffffffc77;
    error_context_p.query_location.index._0_7_ = in_stack_fffffffffffffc70;
    EntryLookupInfo::EntryLookupInfo
              ((EntryLookupInfo *)CONCAT17(in_stack_fffffffffffffc6f,in_stack_fffffffffffffc68),
               (CatalogType)((ulong)in_stack_fffffffffffffc60 >> 0x38),
               (string *)in_stack_fffffffffffffc58,error_context_p);
    unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true>::operator->
              ((unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true> *)
               in_stack_fffffffffffffc60);
    unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true>::operator->
              ((unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true> *)
               in_stack_fffffffffffffc60);
    unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true>::operator->
              ((unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true> *)
               in_stack_fffffffffffffc60);
    local_158 = (CatalogEntry *)
                CatalogEntryRetriever::GetEntry
                          (in_stack_fffffffffffffc88,(string *)in_stack_fffffffffffffc80,
                           (string *)in_stack_fffffffffffffc78,
                           (EntryLookupInfo *)
                           CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),
                           in_stack_fffffffffffffc6f);
    local_110[0] = (optional_ptr<duckdb::CatalogEntry,_true>)local_158;
  }
  local_160 = GetStatementProperties(in_stack_fffffffffffffc60);
  local_160->return_type = NOTHING;
  bVar3 = duckdb::optional_ptr::operator_cast_to_bool((optional_ptr *)local_110);
  if (bVar3) {
    pCVar6 = optional_ptr<duckdb::CatalogEntry,_true>::operator->
                       ((optional_ptr<duckdb::CatalogEntry,_true> *)in_stack_fffffffffffffc60);
    iVar4 = (*pCVar6->_vptr_CatalogEntry[0xb])();
    local_180 = (__node_base_ptr)CONCAT44(extraout_var,iVar4);
    bVar3 = Catalog::IsSystemCatalog((Catalog *)0xde8041);
    if (bVar3) {
      local_1c8[0x26] = 1;
      uVar7 = __cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_1a0,"Can not comment on System Catalog entries",
                 (allocator *)(local_1c8 + 0x27));
      BinderException::BinderException
                ((BinderException *)in_stack_fffffffffffffc60,(string *)in_stack_fffffffffffffc58);
      local_1c8[0x26] = 0;
      __cxa_throw(uVar7,&BinderException::typeinfo,BinderException::~BinderException);
    }
    pCVar6 = optional_ptr<duckdb::CatalogEntry,_true>::operator->
                       ((optional_ptr<duckdb::CatalogEntry,_true> *)in_stack_fffffffffffffc60);
    if ((pCVar6->temporary & 1U) == 0) {
      StatementProperties::RegisterDBModify
                (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,
                 (ClientContext *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70));
    }
    args = Catalog::GetName_abi_cxx11_((Catalog *)0xde8181);
    pAVar5 = unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true>::operator->
                       ((unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true>
                         *)in_stack_fffffffffffffc60);
    ::std::__cxx11::string::operator=((string *)&pAVar5->catalog,(string *)args);
    pCVar6 = optional_ptr<duckdb::CatalogEntry,_true>::operator->
                       ((optional_ptr<duckdb::CatalogEntry,_true> *)in_stack_fffffffffffffc60);
    iVar4 = (*pCVar6->_vptr_CatalogEntry[0xd])();
    psVar8 = (string *)(CONCAT44(extraout_var_00,iVar4) + 0x20);
    pAVar9 = unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true>::operator->
                       ((unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true>
                         *)in_stack_fffffffffffffc60);
    ::std::__cxx11::string::operator=((string *)&pAVar9->schema,psVar8);
    pAVar9 = unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true>::operator->
                       ((unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true>
                         *)in_stack_fffffffffffffc60);
    bVar3 = AlterInfo::IsAddPrimaryKey(pAVar9);
    if (bVar3) {
      optional_ptr<duckdb::CatalogEntry,_true>::operator*
                ((optional_ptr<duckdb::CatalogEntry,_true> *)in_stack_fffffffffffffc60);
      in_stack_fffffffffffffc60 = (Binder *)local_1c8;
      unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true>::unique_ptr
                ((unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true> *)
                 in_stack_fffffffffffffc60,
                 (unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true> *)
                 in_stack_fffffffffffffc58);
      BindAlterAddIndex((Binder *)in_stack_ffffffffffffffb8.ptr,
                        (BoundStatement *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                        (unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true>
                         *)in_stack_ffffffffffffffa0);
      unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true>::~unique_ptr
                ((unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true> *)
                 0xde834b);
    }
    else {
      local_1c8[0xf] = 0x7d;
      make_uniq<duckdb::LogicalSimple,duckdb::LogicalOperatorType,duckdb::unique_ptr<duckdb::AlterInfo,std::default_delete<duckdb::AlterInfo>,true>>
                ((LogicalOperatorType *)args,
                 (unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true> *)
                 pAVar5);
      unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>::
      unique_ptr<duckdb::LogicalSimple,std::default_delete<std::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>>>,void>
                ((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)in_stack_fffffffffffffc60,
                 (unique_ptr<duckdb::LogicalSimple,_std::default_delete<duckdb::LogicalSimple>_> *)
                 in_stack_fffffffffffffc58);
      unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
      operator=((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                 *)in_stack_fffffffffffffc60,&in_stack_fffffffffffffc58->plan);
      unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
      ~unique_ptr((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                   *)0xde82b1);
      unique_ptr<duckdb::LogicalSimple,_std::default_delete<duckdb::LogicalSimple>,_true>::
      ~unique_ptr((unique_ptr<duckdb::LogicalSimple,_std::default_delete<duckdb::LogicalSimple>,_true>
                   *)0xde82be);
      BoundStatement::BoundStatement
                ((BoundStatement *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
    }
  }
  else {
    local_171 = 0x7d;
    make_uniq<duckdb::LogicalSimple,duckdb::LogicalOperatorType,duckdb::unique_ptr<duckdb::AlterInfo,std::default_delete<duckdb::AlterInfo>,true>>
              ((LogicalOperatorType *)in_stack_fffffffffffffca8,
               (unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true> *)
               in_stack_fffffffffffffca0);
    unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>::
    unique_ptr<duckdb::LogicalSimple,std::default_delete<std::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>>>,void>
              ((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)in_stack_fffffffffffffc60,
               (unique_ptr<duckdb::LogicalSimple,_std::default_delete<duckdb::LogicalSimple>_> *)
               in_stack_fffffffffffffc58);
    unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
    operator=((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               *)in_stack_fffffffffffffc60,&in_stack_fffffffffffffc58->plan);
    unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
    ~unique_ptr((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                 *)0xde7fc6);
    unique_ptr<duckdb::LogicalSimple,_std::default_delete<duckdb::LogicalSimple>,_true>::~unique_ptr
              ((unique_ptr<duckdb::LogicalSimple,_std::default_delete<duckdb::LogicalSimple>,_true>
                *)0xde7fd3);
    BoundStatement::BoundStatement
              ((BoundStatement *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
  }
  local_178 = 1;
  BoundStatement::~BoundStatement((BoundStatement *)in_stack_fffffffffffffc60);
  return in_RDI;
}

Assistant:

BoundStatement Binder::Bind(AlterStatement &stmt) {
	BoundStatement result;
	result.names = {"Success"};
	result.types = {LogicalType::BOOLEAN};
	BindSchemaOrCatalog(stmt.info->catalog, stmt.info->schema);

	optional_ptr<CatalogEntry> entry;
	if (stmt.info->type == AlterType::SET_COLUMN_COMMENT) {
		// Extra step for column comments: They can alter a table or a view, and we resolve that here.
		auto &info = stmt.info->Cast<SetColumnCommentInfo>();
		entry = info.TryResolveCatalogEntry(entry_retriever);

	} else {
		// For any other ALTER, we retrieve the catalog entry directly.
		EntryLookupInfo lookup_info(stmt.info->GetCatalogType(), stmt.info->name);
		entry = entry_retriever.GetEntry(stmt.info->catalog, stmt.info->schema, lookup_info, stmt.info->if_not_found);
	}

	auto &properties = GetStatementProperties();
	properties.return_type = StatementReturnType::NOTHING;
	if (!entry) {
		result.plan = make_uniq<LogicalSimple>(LogicalOperatorType::LOGICAL_ALTER, std::move(stmt.info));
		return result;
	}

	D_ASSERT(!entry->deleted);
	auto &catalog = entry->ParentCatalog();
	if (catalog.IsSystemCatalog()) {
		throw BinderException("Can not comment on System Catalog entries");
	}
	if (!entry->temporary) {
		// We can only alter temporary tables and views in read-only mode.
		properties.RegisterDBModify(catalog, context);
	}
	stmt.info->catalog = catalog.GetName();
	stmt.info->schema = entry->ParentSchema().name;

	if (!stmt.info->IsAddPrimaryKey()) {
		result.plan = make_uniq<LogicalSimple>(LogicalOperatorType::LOGICAL_ALTER, std::move(stmt.info));
		return result;
	}

	return BindAlterAddIndex(result, *entry, std::move(stmt.info));
}